

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_sort_vectors(void)

{
  int iVar1;
  int i;
  secp256k1_pubkey *pks_ptr [6];
  secp256k1_pubkey *sorted [6];
  secp256k1_pubkey pubkeys [6];
  uchar pk_ser [6] [33];
  size_t in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int iVar2;
  secp256k1_context *in_stack_fffffffffffffd58;
  undefined1 *local_278 [3];
  undefined1 *inputlen;
  uchar *input;
  secp256k1_pubkey *pubkey;
  secp256k1_context *in_stack_fffffffffffffdb8;
  uchar auStack_208 [64];
  secp256k1_pubkey sStack_1c8;
  undefined1 auStack_188 [64];
  undefined1 auStack_148 [128];
  undefined1 local_c8 [200];
  
  memcpy(local_c8,&DAT_00174000,0xc6);
  local_278[0] = auStack_188;
  local_278[1] = &stack0xfffffffffffffdb8;
  local_278[2] = &stack0xfffffffffffffdb8;
  inputlen = auStack_148;
  input = auStack_208;
  pubkey = &sStack_1c8;
  iVar2 = 0;
  while( true ) {
    if (5 < iVar2) {
      iVar2 = secp256k1_pubkey_sort
                        (in_stack_fffffffffffffd58,
                         (secp256k1_pubkey **)CONCAT44(iVar2,in_stack_fffffffffffffd50),
                         in_stack_fffffffffffffd48);
      if (iVar2 != 1) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
                ,0x307,"test condition failed: secp256k1_pubkey_sort(CTX, pks_ptr, N_PUBKEYS) == 1")
        ;
        abort();
      }
      iVar2 = 0;
      while( true ) {
        if (5 < iVar2) {
          return;
        }
        iVar1 = secp256k1_memcmp_var
                          (*(void **)(&stack0xfffffffffffffd58 + (long)iVar2 * 8),local_278[iVar2],
                           0x40);
        if (iVar1 != 0) break;
        iVar2 = iVar2 + 1;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
              ,0x309,
              "test condition failed: secp256k1_memcmp_var(pks_ptr[i], sorted[i], sizeof(secp256k1_pubkey)) == 0"
             );
      abort();
    }
    iVar1 = secp256k1_ec_pubkey_parse(in_stack_fffffffffffffdb8,pubkey,input,(size_t)inputlen);
    if (iVar1 == 0) break;
    *(undefined1 **)(&stack0xfffffffffffffd58 + (long)iVar2 * 8) =
         &stack0xfffffffffffffdb8 + (long)iVar2 * 0x40;
    iVar2 = iVar2 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
          ,0x304,
          "test condition failed: secp256k1_ec_pubkey_parse(CTX, &pubkeys[i], pk_ser[i], sizeof(pk_ser[i]))"
         );
  abort();
}

Assistant:

static void test_sort_vectors(void) {
    enum { N_PUBKEYS = 6 };
    unsigned char pk_ser[N_PUBKEYS][33] = {
        { 0x02, 0xDD, 0x30, 0x8A, 0xFE, 0xC5, 0x77, 0x7E, 0x13, 0x12, 0x1F,
          0xA7, 0x2B, 0x9C, 0xC1, 0xB7, 0xCC, 0x01, 0x39, 0x71, 0x53, 0x09,
          0xB0, 0x86, 0xC9, 0x60, 0xE1, 0x8F, 0xD9, 0x69, 0x77, 0x4E, 0xB8 },
        { 0x02, 0xF9, 0x30, 0x8A, 0x01, 0x92, 0x58, 0xC3, 0x10, 0x49, 0x34,
          0x4F, 0x85, 0xF8, 0x9D, 0x52, 0x29, 0xB5, 0x31, 0xC8, 0x45, 0x83,
          0x6F, 0x99, 0xB0, 0x86, 0x01, 0xF1, 0x13, 0xBC, 0xE0, 0x36, 0xF9 },
        { 0x03, 0xDF, 0xF1, 0xD7, 0x7F, 0x2A, 0x67, 0x1C, 0x5F, 0x36, 0x18,
          0x37, 0x26, 0xDB, 0x23, 0x41, 0xBE, 0x58, 0xFE, 0xAE, 0x1D, 0xA2,
          0xDE, 0xCE, 0xD8, 0x43, 0x24, 0x0F, 0x7B, 0x50, 0x2B, 0xA6, 0x59 },
        { 0x02, 0x35, 0x90, 0xA9, 0x4E, 0x76, 0x8F, 0x8E, 0x18, 0x15, 0xC2,
          0xF2, 0x4B, 0x4D, 0x80, 0xA8, 0xE3, 0x14, 0x93, 0x16, 0xC3, 0x51,
          0x8C, 0xE7, 0xB7, 0xAD, 0x33, 0x83, 0x68, 0xD0, 0x38, 0xCA, 0x66 },
        { 0x02, 0xDD, 0x30, 0x8A, 0xFE, 0xC5, 0x77, 0x7E, 0x13, 0x12, 0x1F,
          0xA7, 0x2B, 0x9C, 0xC1, 0xB7, 0xCC, 0x01, 0x39, 0x71, 0x53, 0x09,
          0xB0, 0x86, 0xC9, 0x60, 0xE1, 0x8F, 0xD9, 0x69, 0x77, 0x4E, 0xFF },
        { 0x02, 0xDD, 0x30, 0x8A, 0xFE, 0xC5, 0x77, 0x7E, 0x13, 0x12, 0x1F,
          0xA7, 0x2B, 0x9C, 0xC1, 0xB7, 0xCC, 0x01, 0x39, 0x71, 0x53, 0x09,
          0xB0, 0x86, 0xC9, 0x60, 0xE1, 0x8F, 0xD9, 0x69, 0x77, 0x4E, 0xB8 }
    };
    secp256k1_pubkey pubkeys[N_PUBKEYS];
    secp256k1_pubkey *sorted[N_PUBKEYS];
    const secp256k1_pubkey *pks_ptr[N_PUBKEYS];
    int i;

    sorted[0] = &pubkeys[3];
    sorted[1] = &pubkeys[0];
    sorted[2] = &pubkeys[0];
    sorted[3] = &pubkeys[4];
    sorted[4] = &pubkeys[1];
    sorted[5] = &pubkeys[2];

    for (i = 0; i < N_PUBKEYS; i++) {
        CHECK(secp256k1_ec_pubkey_parse(CTX, &pubkeys[i], pk_ser[i], sizeof(pk_ser[i])));
        pks_ptr[i] = &pubkeys[i];
    }
    CHECK(secp256k1_pubkey_sort(CTX, pks_ptr, N_PUBKEYS) == 1);
    for (i = 0; i < N_PUBKEYS; i++) {
        CHECK(secp256k1_memcmp_var(pks_ptr[i], sorted[i], sizeof(secp256k1_pubkey)) == 0);
    }
}